

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyLinkError
               (NegativeTestContext *ctx,ShaderProgram *program)

{
  ostringstream *this;
  TestLog *log;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  log = (ctx->super_CallLogWrapper).m_log;
  glu::operator<<(log,program);
  if ((program->m_program).m_info.linkOk == true) {
    this = (ostringstream *)(local_198 + 8);
    local_198._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Program was not expected to link.",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base(local_120);
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Program was not expected to link.","");
    NegativeTestContext::fail(ctx,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != local_188) {
      operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void verifyLinkError (NegativeTestContext& ctx, const glu::ShaderProgram& program)
{
	bool testFailed = false;

	tcu::TestLog& log = ctx.getLog();
	log << program;

	testFailed = program.getProgramInfo().linkOk;

	if (testFailed)
	{
		const char* const message("Program was not expected to link.");
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}